

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O1

int CfdAddTapBranchByHash(void *handle,void *tree_handle,char *branch_hash)

{
  pointer pcVar1;
  TapBranch *this;
  long *plVar2;
  bool bVar3;
  CfdException *this_00;
  ByteData256 hash;
  allocator local_c9;
  ByteData256 local_c8;
  undefined1 local_b0 [128];
  
  cfd::Initialize();
  pcVar1 = local_b0 + 0x10;
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"TapscriptTree","");
  cfd::capi::CheckBuffer(tree_handle,(string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  bVar3 = cfd::capi::IsEmptyString(branch_hash);
  if (!bVar3) {
    std::__cxx11::string::string((string *)local_b0,branch_hash,&local_c9);
    cfd::core::ByteData256::ByteData256(&local_c8,(string *)local_b0);
    if ((pointer)local_b0._0_8_ != pcVar1) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    this = (TapBranch *)**(undefined8 **)((long)tree_handle + 0x18);
    if (this == (TapBranch *)(*(undefined8 **)((long)tree_handle + 0x18))[1]) {
      plVar2 = (long *)**(long **)((long)tree_handle + 0x10);
      if ((long *)(*(long **)((long)tree_handle + 0x10))[1] == plVar2) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      }
      (**(code **)(*plVar2 + 0x18))(plVar2,&local_c8);
    }
    else {
      cfd::core::TapBranch::ToString_abi_cxx11_((string *)local_b0,this);
      if ((pointer)local_b0._0_8_ != pcVar1) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      if (CONCAT44(local_b0._12_4_,local_b0._8_4_) == 0) {
        cfd::core::TapBranch::TapBranch
                  ((TapBranch *)local_b0,&local_c8,*(NetType *)((long)tree_handle + 0x20));
        cfd::core::TapBranch::operator=(this,(TapBranch *)local_b0);
        cfd::core::TapBranch::~TapBranch((TapBranch *)local_b0);
      }
      else {
        (*this->_vptr_TapBranch[3])(this,&local_c8);
      }
    }
    if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c8.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_b0._0_8_ = "cfdcapi_script.cpp";
  local_b0._8_4_ = 0x2f6;
  local_b0._16_8_ = "CfdAddTapBranchByHash";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,"branch_hash is null or empty.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,"Failed to parameter. branch_hash is null or empty.","");
  cfd::core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_b0);
  __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTapBranchByHash(
    void* handle, void* tree_handle, const char* branch_hash) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    if (IsEmptyString(branch_hash)) {
      warn(CFD_LOG_SOURCE, "branch_hash is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. branch_hash is null or empty.");
    }
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    ByteData256 hash(branch_hash);
    if (!buffer->branch_buffer->empty()) {
      auto& branch = buffer->branch_buffer->at(0);
      if (branch.ToString().empty()) {
        branch = TapBranch(hash, buffer->net_type);  // override
      } else {
        branch.AddBranch(hash);
      }
    } else {
      auto& tree = buffer->tree_buffer->at(0);
      tree.AddBranch(hash);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}